

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_RUBBLE(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_upkeep *ppVar3;
  chunk_conflict *c;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  loc grid;
  wchar_t d;
  uint uVar8;
  long lVar9;
  wchar_t wVar10;
  bool bVar11;
  
  wVar5 = Rand_div(3);
  uVar8 = 0;
  wVar6 = count_feats((loc *)0x0,square_isempty,false);
  wVar10 = wVar5 + L'\x01';
  if (wVar6 <= wVar5) {
    wVar10 = wVar6;
  }
  if (L'\0' < wVar10) {
    do {
      lVar9 = 0;
      do {
        grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid_ddd[lVar9]);
        _Var4 = square_in_bounds_fully(cave,grid);
        if (((_Var4) && (_Var4 = square_isempty(cave,grid), _Var4)) &&
           (uVar7 = Rand_div(3), uVar7 == 0)) {
          uVar7 = Rand_div(2);
          square_set_feat(cave,grid,(uint)(uVar7 == 0) * 8 + L'\x10');
          c = cave;
          if (cave->depth == 0) {
            _Var4 = is_daytime();
            expose_to_sun((chunk *)c,grid,_Var4);
          }
          wVar10 = wVar10 + L'\xffffffff';
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
    } while ((L'\0' < wVar10) && (bVar11 = uVar8 < 9, uVar8 = uVar8 + 1, bVar11));
  }
  context->ident = true;
  ppVar3 = player->upkeep;
  puVar1 = &ppVar3->update;
  *puVar1 = *puVar1 | 0x60;
  pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc0;
  return true;
}

Assistant:

bool effect_handler_RUBBLE(effect_handler_context_t *context)
{
	/*
	 * First we work out how many grids we want to fill with rubble.  Then we
	 * check that we can actually do this, by counting the number of grids
	 * available, limiting the number of rubble grids to this number if
	 * necessary.
	 */
	int rubble_grids = randint1(3);
	int open_grids = count_feats(NULL, square_isempty, false);

	if (rubble_grids > open_grids) {
		rubble_grids = open_grids;
	}

	/* Avoid infinite loops */
	int iterations = 0;

	while (rubble_grids > 0 && iterations < 10) {
		/* Look around the player */
		for (int d = 0; d < 8; d++) {
			/* Extract adjacent (legal) location */
			struct loc grid = loc_sum(player->grid, ddgrid_ddd[d]);
			if (!square_in_bounds_fully(cave, grid)) continue;
			if (!square_isempty(cave, grid)) continue;

			if (one_in_(3)) {
				if (one_in_(2))
					square_set_feat(cave, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(cave, grid, FEAT_RUBBLE);
				if (cave->depth == 0)
					expose_to_sun(cave, grid, is_daytime());
				rubble_grids--;
			}
		}

		iterations++;
	}

	context->ident = true;

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}